

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O0

int __thiscall Fl_Table::is_selected(Fl_Table *this,int r,int c)

{
  int local_30;
  int local_2c;
  int s_bottom;
  int s_top;
  int s_right;
  int s_left;
  int c_local;
  int r_local;
  Fl_Table *this_local;
  
  if (this->current_col < this->select_col) {
    s_top = this->current_col;
    s_bottom = this->select_col;
  }
  else {
    s_bottom = this->current_col;
    s_top = this->select_col;
  }
  if (this->current_row < this->select_row) {
    local_2c = this->current_row;
    local_30 = this->select_row;
  }
  else {
    local_30 = this->current_row;
    local_2c = this->select_row;
  }
  if ((((r < local_2c) || (local_30 < r)) || (c < s_top)) || (s_bottom < c)) {
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Table::is_selected(int r, int c) {
  int s_left, s_right, s_top, s_bottom;
  
  if (select_col > current_col) {
    s_left = current_col;
    s_right = select_col;
  } else {
    s_right = current_col;
    s_left = select_col;
  }
  if (select_row > current_row) {
    s_top = current_row;
    s_bottom = select_row;
  } else {
    s_bottom = current_row;
    s_top = select_row;
  }
  if (r >= s_top && r <= s_bottom && c >= s_left && c <= s_right) {
    return 1;
  }
  return 0;
}